

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_CurrencyDigits
              (RecyclableObject *function,CallInfo callInfo,...)

{
  undefined1 *puVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 *puVar6;
  JavascriptString *pJVar7;
  ScopedICUObject<void_**,_&unum_close_70> SVar8;
  LPCSTR message;
  uint in_stack_00000010;
  Var in_stack_00000020;
  ScopedICUObject<void_**,_&unum_close_70> local_30;
  ScopedUNumberFormat fmt;
  UErrorCode status;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  uVar5 = callInfo._0_4_;
  if (in_stack_00000010 != uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x867,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a2c905;
    *puVar6 = 0;
  }
  if ((uVar5 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x867,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a2c905;
    *puVar6 = 0;
  }
  if ((uVar5 & 0xffffff) == 2) {
    bVar3 = VarIs<Js::JavascriptString>(in_stack_00000020);
    if (!bVar3) goto LAB_00a2c7cc;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x867,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar3) goto LAB_00a2c905;
      *puVar6 = 0;
    }
LAB_00a2c7cc:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x86c,
                                "((args.Info.Count == 2 && VarIs<JavascriptString>(args.Values[1])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar3) goto LAB_00a2c905;
    *puVar6 = 0;
  }
  pJVar7 = UnsafeVarTo<Js::JavascriptString>(in_stack_00000020);
  iVar4 = (*(pJVar7->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar7);
  puVar1 = (undefined1 *)((long)&fmt.object + 4);
  fmt.object._4_4_ = 0;
  SVar8.object = (void **)unum_open_70(2,0,0,0,0,puVar1);
  local_30.object = SVar8.object;
  unum_setTextAttribute_70(SVar8.object,5,iVar4,0xffffffffffffffff,puVar1);
  if (fmt.object._4_4_ == 7) {
    Throw::OutOfMemory();
  }
  if (0 < fmt.object._4_4_ || fmt.object._4_4_ == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    message = (LPCSTR)u_errorName_70(fmt.object._4_4_);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x874,"(false)",message);
    if (!bVar3) {
LAB_00a2c905:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    SVar8.object = local_30.object;
  }
  uVar5 = unum_getAttribute_70(SVar8.object,8);
  PlatformAgnostic::ICUHelpers::ScopedICUObject<void_**,_&unum_close_70>::~ScopedICUObject
            (&local_30);
  return (Var)((ulong)uVar5 | 0x1000000000000);
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_CurrencyDigits(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

        INTL_CHECK_ARGS(
            args.Info.Count == 2 &&
            VarIs<JavascriptString>(args.Values[1])
        );

        const char16 *currencyCode = UnsafeVarTo<JavascriptString>(args.Values[1])->GetSz();

#if defined(INTL_ICU)
        UErrorCode status = U_ZERO_ERROR;
        ScopedUNumberFormat fmt(unum_open(UNUM_CURRENCY, nullptr, 0, nullptr, nullptr, &status));
        unum_setTextAttribute(fmt, UNUM_CURRENCY_CODE, reinterpret_cast<const UChar *>(currencyCode), -1, &status);
        ICU_ASSERT(status, true);

        int currencyDigits = unum_getAttribute(fmt, UNUM_FRACTION_DIGITS);
        return JavascriptNumber::ToVar(currencyDigits, scriptContext);
#else
        HRESULT hr;
        AutoCOMPtr<NumberFormatting::ICurrencyFormatter> currencyFormatter(nullptr);
        IfFailThrowHr(GetWindowsGlobalizationAdapter(scriptContext)->CreateCurrencyFormatterCode(scriptContext, currencyCode, &currencyFormatter));
        AutoCOMPtr<NumberFormatting::INumberFormatterOptions> numberFormatterOptions;
        IfFailThrowHr(currencyFormatter->QueryInterface(__uuidof(NumberFormatting::INumberFormatterOptions), reinterpret_cast<void**>(&numberFormatterOptions)));
        Assert(numberFormatterOptions);
        INT32 fractionDigits;
        IfFailThrowHr(numberFormatterOptions->get_FractionDigits(&fractionDigits));
        return JavascriptNumber::ToVar(fractionDigits, scriptContext);
#endif
    }